

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation_utils.h
# Opt level: O2

void __thiscall
HandleInfo<XrSession_T_*>::removeHandlesForInstance
          (HandleInfo<XrSession_T_*> *this,GenValidUsageXrInstanceInfo *search_value)

{
  _Node_iterator_base<std::pair<XrSession_T_*const,_std::unique_ptr<GenValidUsageXrHandleInfo,_std::default_delete<GenValidUsageXrHandleInfo>_>_>,_false>
  __it;
  UniqueLock lock;
  unique_lock<std::mutex> local_20;
  
  std::unique_lock<std::mutex>::unique_lock
            (&local_20,
             &(this->super_HandleInfoBase<XrSession_T_*,_GenValidUsageXrHandleInfo>).dispatch_mutex_
            );
  __it._M_cur = (__node_type *)
                &(this->super_HandleInfoBase<XrSession_T_*,_GenValidUsageXrHandleInfo>).info_map_.
                 _M_h._M_before_begin;
  do {
    __it._M_cur = (__node_type *)((__it._M_cur)->super__Hash_node_base)._M_nxt;
    while( true ) {
      if (__it._M_cur == (__node_type *)0x0) {
        std::unique_lock<std::mutex>::~unique_lock(&local_20);
        return;
      }
      if ((*(long **)((long)__it._M_cur + 0x10) == (long *)0x0) ||
         ((GenValidUsageXrInstanceInfo *)**(long **)((long)__it._M_cur + 0x10) != search_value))
      break;
      __it._M_cur = (__node_type *)
                    std::
                    _Hashtable<XrSession_T_*,_std::pair<XrSession_T_*const,_std::unique_ptr<GenValidUsageXrHandleInfo,_std::default_delete<GenValidUsageXrHandleInfo>_>_>,_std::allocator<std::pair<XrSession_T_*const,_std::unique_ptr<GenValidUsageXrHandleInfo,_std::default_delete<GenValidUsageXrHandleInfo>_>_>_>,_std::__detail::_Select1st,_std::equal_to<XrSession_T_*>,_std::hash<XrSession_T_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                    ::erase((_Hashtable<XrSession_T_*,_std::pair<XrSession_T_*const,_std::unique_ptr<GenValidUsageXrHandleInfo,_std::default_delete<GenValidUsageXrHandleInfo>_>_>,_std::allocator<std::pair<XrSession_T_*const,_std::unique_ptr<GenValidUsageXrHandleInfo,_std::default_delete<GenValidUsageXrHandleInfo>_>_>_>,_std::__detail::_Select1st,_std::equal_to<XrSession_T_*>,_std::hash<XrSession_T_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                             *)this,__it._M_cur);
    }
  } while( true );
}

Assistant:

inline void HandleInfo<HandleType>::removeHandlesForInstance(GenValidUsageXrInstanceInfo *search_value) {
    typedef typename base_t::value_t value_t;
    UniqueLock lock(this->dispatch_mutex_);
    map_erase_if(this->info_map_, [=](value_t const &data) { return data.second && data.second->instance_info == search_value; });
}